

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

InputSlot * __thiscall
QPlatformPrintDevice::defaultInputSlot(InputSlot *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->id = 0xaaaaaaaa;
  __return_storage_ptr__->windowsId = -0x55555556;
  local_50.d = (Data *)0x0;
  local_50.ptr = (char *)0x0;
  local_50.size = 0;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  local_38.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = "Auto";
  local_38.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->key).d.size = 4;
  local_38.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  QCoreApplication::translate((char *)&local_38,"Print Device Input Slot","Automatic",0);
  pDVar1 = local_38.d;
  local_38.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.d = pDVar1;
  (__return_storage_ptr__->name).d.ptr = local_38.ptr;
  local_38.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = local_38.size;
  local_38.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  __return_storage_ptr__->id = Auto;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPrint::InputSlot QPlatformPrintDevice::defaultInputSlot() const
{
    QPrint::InputSlot input;
    input.key = QByteArrayLiteral("Auto");
    input.name = QCoreApplication::translate("Print Device Input Slot", "Automatic");
    input.id = QPrint::Auto;
    return input;
}